

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

bool __thiscall FTagManager::LineHasID(FTagManager *this,int i,int tag)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  
  bVar4 = false;
  if ((-1 < i) && (bVar4 = false, i < (int)(this->startForLine).Count)) {
    lVar2 = (long)(this->startForLine).Array[(uint)i];
    if (lVar2 < 0) {
      return false;
    }
    piVar3 = &(this->allIDs).Array[lVar2].tag;
    do {
      bVar4 = ((FTagItem *)(piVar3 + -1))->target == i;
      if (!bVar4) {
        return bVar4;
      }
      iVar1 = *piVar3;
      piVar3 = piVar3 + 3;
    } while (iVar1 != tag);
  }
  return bVar4;
}

Assistant:

bool FTagManager::LineHasID(int i, int tag) const
{
	if (LineHasIDs(i))
	{
		int ndx = startForLine[i];
		while (allIDs[ndx].target == i)
		{
			if (allIDs[ndx].tag == tag) return true;
			ndx++;
		}
	}
	return false;
}